

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool __thiscall ImGuiTextFilter::PassFilter(ImGuiTextFilter *this,char *text,char *text_end)

{
  char cVar1;
  ImGuiTextRange *pIVar2;
  char *needle_end;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  char *haystack;
  bool bVar6;
  
  uVar4 = (ulong)(uint)(this->Filters).Size;
  if (uVar4 == 0) {
    bVar6 = true;
  }
  else {
    haystack = "";
    if (text != (char *)0x0) {
      haystack = text;
    }
    pIVar2 = (this->Filters).Data;
    lVar5 = 0;
    do {
      pcVar3 = *(char **)((long)&pIVar2->b + lVar5);
      needle_end = *(char **)((long)&pIVar2->e + lVar5);
      if (pcVar3 != needle_end) {
        cVar1 = *pcVar3;
        if (cVar1 == '-') {
          pcVar3 = pcVar3 + 1;
        }
        pcVar3 = ImStristr(haystack,text_end,pcVar3,needle_end);
        if (pcVar3 != (char *)0x0) {
          return cVar1 != '-';
        }
      }
      lVar5 = lVar5 + 0x10;
    } while (uVar4 << 4 != lVar5);
    bVar6 = this->CountGrep == 0;
  }
  return bVar6;
}

Assistant:

void*   ImFileLoadToMemory(const char* filename, const char* mode, size_t* out_file_size, int padding_bytes)
{
    IM_ASSERT(filename && mode);
    if (out_file_size)
        *out_file_size = 0;

    ImFileHandle f;
    if ((f = ImFileOpen(filename, mode)) == NULL)
        return NULL;

    size_t file_size = (size_t)ImFileGetSize(f);
    if (file_size == (size_t)-1)
    {
        ImFileClose(f);
        return NULL;
    }

    void* file_data = IM_ALLOC(file_size + padding_bytes);
    if (file_data == NULL)
    {
        ImFileClose(f);
        return NULL;
    }
    if (ImFileRead(file_data, 1, file_size, f) != file_size)
    {
        ImFileClose(f);
        IM_FREE(file_data);
        return NULL;
    }
    if (padding_bytes > 0)
        memset((void*)(((char*)file_data) + file_size), 0, (size_t)padding_bytes);

    ImFileClose(f);
    if (out_file_size)
        *out_file_size = file_size;

    return file_data;
}